

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::Init(idx2_file *Idx2,params *P)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  undefined8 in_RCX;
  uint unaff_R12D;
  uint uVar4;
  cstr __s;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar5;
  stref Dir;
  
  Dir.field_0._4_4_ = 0;
  Dir.field_0._0_4_ = (P->InDir).Size;
  Dir._8_8_ = in_RCX;
  SetDir((idx2 *)Idx2,(idx2_file *)(P->InDir).field_0.Ptr,Dir);
  SetDownsamplingFactor(Idx2,&P->DownsamplingFactor3);
  __s = (cstr)(*in_FS_OFFSET + -0xf80);
  snprintf(__s,0x400,"%s",P->InputFile);
  eVar5 = ReadMetaFile(Idx2,__s);
  if (eVar5.Code != NoError) {
    if ('?' < eVar5.StackIdx) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                    ,0x1b,
                    "auto idx2::Init(idx2_file *, params &)::(anonymous class)::operator()() const")
      ;
    }
    bVar3 = eVar5.StackIdx + 1;
    unaff_R12D = eVar5._8_4_ & 0xff00ff | (uint)bVar3 << 8;
    *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar3 * 4) = 0x1b;
    *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar3 * 8) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp";
    __s = eVar5.Msg;
  }
  if (eVar5.Code == NoError) {
    eVar5 = Finalize(Idx2,P);
    if (eVar5.Code != NoError) {
      if ('?' < eVar5.StackIdx) {
        __assert_fail("false && \"stack too deep\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                      ,0x1c,
                      "auto idx2::Init(idx2_file *, params &)::(anonymous class)::operator()() const"
                     );
      }
      bVar3 = eVar5.StackIdx + 1;
      unaff_R12D = eVar5._8_4_ & 0xff00ff | (uint)bVar3 << 8;
      *(undefined4 *)(*in_FS_OFFSET + -0x980 + (long)(char)bVar3 * 4) = 0x1c;
      *(char **)(*in_FS_OFFSET + -0xb80 + (long)(char)bVar3 * 8) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      __s = eVar5.Msg;
    }
    if (eVar5.Code == NoError) {
      if (((P->DecodeExtent).Dims & 0x7fffffffffffffff) == 0) {
        uVar4 = (Idx2->Dims3).field_0.field_0.X;
        uVar1 = (Idx2->Dims3).field_0.field_0.Y;
        uVar2 = (Idx2->Dims3).field_0.field_0.Z;
        (P->DecodeExtent).From = 0;
        (P->DecodeExtent).Dims =
             (ulong)(uVar2 & 0x1fffff) << 0x2a |
             ((ulong)uVar1 & 0x1fffff) << 0x15 | (ulong)uVar4 & 0x1fffff;
      }
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x1f;
      unaff_R12D = 0;
      __s = "";
    }
  }
  uVar4 = unaff_R12D & 0xffffff;
  eVar5.Code = (char)uVar4;
  eVar5.StackIdx = (char)(uVar4 >> 8);
  eVar5.StrGened = (bool)(char)(uVar4 >> 0x10);
  eVar5._11_1_ = (char)(uVar4 >> 0x18);
  eVar5.Msg = __s;
  eVar5._12_4_ = 0;
  return eVar5;
}

Assistant:

error<idx2_err_code>
Init(idx2_file* Idx2, params& P)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFile(Idx2, idx2_PrintScratch("%s", P.InputFile)));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}